

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::uhugeint_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::NumericTryCastToBit>>
               (uhugeint_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  long lVar5;
  ValidityMask *pVVar6;
  ValidityMask *pVVar7;
  ValidityMask *pVVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  string_t sVar13;
  uhugeint_t input;
  uhugeint_t input_00;
  uhugeint_t input_01;
  ulong local_80;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = 8;
      pVVar8 = (ValidityMask *)0x0;
      do {
        input.upper = (uint64_t)result_mask;
        input.lower = *(uint64_t *)((long)&ldata->lower + lVar5);
        sVar13 = VectorStringCastOperator<duckdb::NumericTryCastToBit>::
                 Operation<duckdb::uhugeint_t,duckdb::string_t>
                           (*(VectorStringCastOperator<duckdb::NumericTryCastToBit> **)
                             ((long)ldata + lVar5 + -8),input,pVVar8,(idx_t)dataptr,dataptr);
        *(long *)((long)result_data + lVar5 + -8) = sVar13.value._0_8_;
        *(long *)((long)&result_data->value + lVar5) = sVar13.value._8_8_;
        pVVar8 = (ValidityMask *)
                 ((long)&(pVVar8->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
        lVar5 = lVar5 + 0x10;
      } while ((ValidityMask *)count != pVVar8);
    }
  }
  else {
    pvVar9 = dataptr;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var3 = p_Stack_40;
      peVar2 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar4->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_80 = 0;
      pVVar8 = (ValidityMask *)0x0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          pVVar6 = pVVar8 + 2;
          if (count <= pVVar8 + 2) {
            pVVar6 = (ValidityMask *)count;
          }
LAB_00fbc659:
          pVVar7 = pVVar8;
          if (pVVar8 < pVVar6) {
            uVar11 = (long)pVVar8 << 4 | 8;
            do {
              input_01.upper = (uint64_t)result_mask;
              input_01.lower = *(uint64_t *)((long)&ldata->lower + uVar11);
              sVar13 = VectorStringCastOperator<duckdb::NumericTryCastToBit>::
                       Operation<duckdb::uhugeint_t,duckdb::string_t>
                                 (*(VectorStringCastOperator<duckdb::NumericTryCastToBit> **)
                                   ((long)ldata + (uVar11 - 8)),input_01,pVVar8,(idx_t)dataptr,
                                  pvVar9);
              *(long *)((long)result_data + (uVar11 - 8)) = sVar13.value._0_8_;
              *(long *)((long)&result_data->value + uVar11) = sVar13.value._8_8_;
              pVVar8 = (ValidityMask *)
                       ((long)&(pVVar8->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                       1);
              uVar11 = uVar11 + 0x10;
              pVVar7 = pVVar6;
            } while (pVVar6 != pVVar8);
          }
        }
        else {
          uVar11 = puVar1[local_80];
          pVVar6 = pVVar8 + 2;
          if (count <= pVVar8 + 2) {
            pVVar6 = (ValidityMask *)count;
          }
          pVVar7 = pVVar6;
          if (uVar11 != 0) {
            if (uVar11 == 0xffffffffffffffff) goto LAB_00fbc659;
            pVVar7 = pVVar8;
            if (pVVar8 < pVVar6) {
              uVar12 = (long)pVVar8 << 4 | 8;
              uVar10 = 0;
              do {
                if ((uVar11 >> (uVar10 & 0x3f) & 1) != 0) {
                  input_00.upper = (uint64_t)result_mask;
                  input_00.lower = *(uint64_t *)((long)&ldata->lower + uVar12);
                  sVar13 = VectorStringCastOperator<duckdb::NumericTryCastToBit>::
                           Operation<duckdb::uhugeint_t,duckdb::string_t>
                                     (*(VectorStringCastOperator<duckdb::NumericTryCastToBit> **)
                                       ((long)ldata + (uVar12 - 8)),input_00,
                                      (ValidityMask *)
                                      ((long)&(pVVar8->super_TemplatedValidityMask<unsigned_long>).
                                              validity_mask + uVar10),(idx_t)dataptr,pvVar9);
                  *(long *)((long)result_data + (uVar12 - 8)) = sVar13.value._0_8_;
                  *(long *)((long)&result_data->value + uVar12) = sVar13.value._8_8_;
                }
                uVar10 = uVar10 + 1;
                uVar12 = uVar12 + 0x10;
                pVVar7 = pVVar6;
              } while ((long)pVVar6 - (long)pVVar8 != uVar10);
            }
          }
        }
        local_80 = local_80 + 1;
        pVVar8 = pVVar7;
      } while (local_80 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}